

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  char cVar3;
  byte bVar4;
  short sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  short *psVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ushort uVar19;
  int iVar20;
  bool bVar21;
  uint local_64;
  
  uVar13 = 0xb;
  if (tableLog != 0) {
    uVar13 = (ulong)tableLog;
  }
  uVar16 = (uint)uVar13;
  uVar7 = 0xffffffffffffffff;
  if (4 < uVar16) {
    if (uVar16 < 0xd) {
      uVar11 = 0x1f;
      if ((uint)total != 0) {
        for (; (uint)total >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar6 = (uVar11 ^ 0xffffffe0) + 0x21;
      uVar11 = 0x1f;
      if (maxSymbolValue != 0) {
        for (; maxSymbolValue >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffffffe0) + 0x22;
      if (uVar6 < uVar11) {
        uVar11 = uVar6;
      }
      if (uVar11 <= uVar16) {
        uVar19 = -(ushort)(useLowProbCount != 0) | 1;
        bVar4 = (byte)uVar13;
        cVar3 = -bVar4;
        bVar9 = cVar3 + 0x3e;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = total & 0xffffffff;
        uVar16 = 1 << (bVar4 & 0x1f);
        uVar11 = 0;
        local_64 = 0;
        uVar7 = 0;
        uVar15 = (ulong)uVar16;
        while( true ) {
          iVar20 = (int)uVar15;
          uVar6 = (uint)(total >> (bVar4 & 0x3f));
          if (maxSymbolValue < uVar11) break;
          uVar18 = (ulong)count[uVar11];
          if (uVar18 == total) {
            return 0;
          }
          if (uVar18 == 0) {
            normalizedCounter[uVar11] = 0;
          }
          else if (uVar6 < count[uVar11]) {
            uVar18 = uVar18 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar2,0);
            uVar15 = uVar18 >> (bVar9 & 0x3f);
            if ((uVar15 & 0xfff8) == 0) {
              uVar15 = (ulong)((int)uVar15 +
                              (uint)((ulong)FSE_normalizeCount::rtbTable[uVar15 & 0xffff] <<
                                     (cVar3 + 0x2aU & 0x3f) <
                                    uVar18 - ((uVar15 & 0xffff) << (bVar9 & 0x3f))));
            }
            uVar10 = (ushort)uVar15;
            if ((ushort)uVar7 < uVar10) {
              local_64 = uVar11;
            }
            if ((ushort)uVar7 < uVar10) {
              uVar7 = uVar15 & 0xffff;
            }
            normalizedCounter[uVar11] = uVar10;
            uVar15 = (ulong)(uint)(iVar20 - (int)(uVar15 & 0xffff));
          }
          else {
            normalizedCounter[uVar11] = uVar19;
            uVar15 = (ulong)(iVar20 - 1);
          }
          uVar11 = uVar11 + 1;
        }
        sVar5 = normalizedCounter[local_64];
        iVar17 = (int)sVar5 >> 1;
        if (iVar17 == -iVar20 || SBORROW4(iVar17,-iVar20) != iVar17 + iVar20 < 0) {
          uVar15 = total * 3 >> (bVar4 + 1 & 0x3f);
          uVar18 = (ulong)(maxSymbolValue + 1);
          uVar11 = 0;
          for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
            uVar1 = count[uVar7];
            if ((ulong)uVar1 == 0) {
              normalizedCounter[uVar7] = 0;
            }
            else {
              if (uVar6 < uVar1) {
                if ((uint)uVar15 < uVar1) {
                  normalizedCounter[uVar7] = -2;
                  goto LAB_00604a62;
                }
                normalizedCounter[uVar7] = 1;
              }
              else {
                normalizedCounter[uVar7] = uVar19;
              }
              uVar11 = uVar11 + 1;
              total = total - uVar1;
            }
LAB_00604a62:
          }
          uVar6 = uVar16 - uVar11;
          if (uVar6 == 0) {
            return uVar13;
          }
          if ((uVar15 & 0xffffffff) < total / uVar6) {
            uVar7 = total * 3;
            for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
              if ((normalizedCounter[uVar15] == -2) &&
                 (uVar1 = count[uVar15], uVar1 <= (uint)(uVar7 / (uVar6 * 2)))) {
                normalizedCounter[uVar15] = 1;
                uVar11 = uVar11 + 1;
                total = total - uVar1;
              }
            }
            uVar6 = uVar16 - uVar11;
          }
          uVar15 = (ulong)uVar6;
          if (uVar11 != maxSymbolValue + 1) {
            if (total == 0) {
              uVar16 = 0;
              while ((int)uVar15 != 0) {
                if (0 < normalizedCounter[uVar16]) {
                  uVar15 = (ulong)((int)uVar15 - 1);
                  normalizedCounter[uVar16] = normalizedCounter[uVar16] + 1;
                }
                bVar21 = uVar16 == maxSymbolValue;
                uVar16 = uVar16 + 1;
                if (bVar21) {
                  uVar16 = 0;
                }
              }
              return uVar13;
            }
            uVar18 = ~(-1L << (cVar3 + 0x3dU & 0x3f));
            uVar16 = 0;
            uVar7 = uVar18;
            do {
              if (maxSymbolValue < uVar16) {
                return uVar13;
              }
              uVar8 = uVar7;
              if (normalizedCounter[uVar16] == -2) {
                uVar8 = (ulong)count[uVar16] *
                        (((uVar15 << (bVar9 & 0x3f)) + uVar18) / (total & 0xffffffff)) + uVar7;
                uVar7 = uVar7 >> (bVar9 & 0x3f);
                uVar14 = uVar8 >> (bVar9 & 0x3f);
                if (uVar14 == uVar7) {
                  return 0xffffffffffffffff;
                }
                normalizedCounter[uVar16] = (short)uVar14 - (short)uVar7;
              }
              uVar16 = uVar16 + 1;
              uVar7 = uVar8;
            } while( true );
          }
          uVar7 = 0;
          uVar16 = 0;
          for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
            if (uVar16 < count[uVar8]) {
              uVar7 = uVar8 & 0xffffffff;
              uVar16 = count[uVar8];
            }
          }
          psVar12 = normalizedCounter + uVar7;
          sVar5 = *psVar12;
        }
        else {
          psVar12 = normalizedCounter + local_64;
        }
        *psVar12 = sVar5 + (short)uVar15;
        uVar7 = uVar13;
      }
    }
    else {
      uVar7 = 0xffffffffffffffd4;
    }
  }
  return uVar7;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}